

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void y_string_suite::y_string_accepted_surrogate_pairs(void)

{
  char input [29];
  reader reader;
  undefined4 local_19c;
  return_type local_198;
  char local_178 [32];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_178 + 0x10,"d83d\\udc8d\"]",0xd);
  builtin_strncpy(local_178,"[\"\\ud83d\\ude39\\u",0x10);
  local_198._M_dataplus._M_p = (pointer)strlen(local_178);
  local_198._M_string_length = (size_type)local_178;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_198);
  local_19c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd89,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_198,&local_19c
            );
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_19c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8b,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_198,&local_19c
            );
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::value(&local_198,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[13]>
            ("reader.value<std::string>()",
             "\"\\xED\\xA0\\xBD\\xED\\xB8\\xB9\\xED\\xA0\\xBD\\xED\\xB2\\x8D\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8c,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_198,
             anon_var_dwarf_526a);
  std::__cxx11::string::~string((string *)&local_198);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_19c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8e,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_198,&local_19c
            );
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_198._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_19c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd90,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_198,&local_19c
            );
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void y_string_accepted_surrogate_pairs()
{
    const char input[] = "[\"\\ud83d\\ude39\\ud83d\\udc8d\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xED\xA0\xBD\xED\xB8\xB9\xED\xA0\xBD\xED\xB2\x8D");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}